

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O0

void __thiscall
QVariantAnimationPrivate::recalculateCurrentInterval(QVariantAnimationPrivate *this,bool force)

{
  bool bVar1;
  parameter_type pVar2;
  parameter_type pVar3;
  qsizetype qVar4;
  parameter_type progress_00;
  pair<double,_QVariant> *ppVar5;
  byte in_SIL;
  long in_RDI;
  _func_bool_pair<double,_QVariant>_ptr_pair<double,_QVariant>_ptr *__comp;
  long in_FS_OFFSET;
  qreal endProgress;
  const_iterator it;
  qreal progress;
  type in_stack_fffffffffffffe88;
  pair<double,_QVariant> *in_stack_fffffffffffffe90;
  QEasingCurve *in_stack_fffffffffffffe98;
  const_iterator cVar6;
  const_iterator __first;
  const_iterator in_stack_fffffffffffffee0;
  const_iterator in_stack_fffffffffffffee8;
  const_iterator local_d8;
  undefined8 local_d0;
  const_iterator local_c8;
  undefined8 local_c0;
  const_iterator local_b8;
  const_iterator local_b0;
  qreal local_a8;
  pair<double,_QVariant> local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar4 = QList<std::pair<double,_QVariant>_>::size
                    ((QList<std::pair<double,_QVariant>_> *)(in_RDI + 0x140));
  bVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffe90);
  if (1 < qVar4 + (int)(uint)bVar1) {
    pVar2 = ::QObjectCompatProperty::operator_cast_to_Direction
                      ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                        *)0x68db84);
    cVar6.i = (pair<double,_QVariant> *)0x0;
    __first.i = (pair<double,_QVariant> *)0x3ff0000000000000;
    if (pVar2 != Forward) {
      __first.i = (pair<double,_QVariant> *)0x0;
    }
    progress_00 = QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
                  ::value((QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
                           *)in_stack_fffffffffffffe90);
    pVar3 = ::QObjectCompatProperty::operator_cast_to_int
                      ((QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
                        *)0x68dbe2);
    if (pVar3 != 0) {
      ::QObjectCompatProperty::operator_cast_to_int
                ((QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
                  *)0x68dc17);
    }
    local_a8 = QEasingCurve::valueForProgress(in_stack_fffffffffffffe98,(qreal)progress_00);
    if ((((in_SIL & 1) != 0) ||
        ((0.0 < *(double *)(in_RDI + 0xe0) && (local_a8 < *(double *)(in_RDI + 0xe0))))) ||
       ((*(double *)(in_RDI + 0x108) <= 1.0 && *(double *)(in_RDI + 0x108) != 1.0 &&
        (*(double *)(in_RDI + 0x108) <= local_a8 && local_a8 != *(double *)(in_RDI + 0x108))))) {
      local_b0.i = (pair<double,_QVariant> *)&DAT_aaaaaaaaaaaaaaaa;
      __comp = (_func_bool_pair<double,_QVariant>_ptr_pair<double,_QVariant>_ptr *)(in_RDI + 0x140);
      QList<std::pair<double,_QVariant>_>::constBegin
                ((QList<std::pair<double,_QVariant>_> *)in_stack_fffffffffffffe90);
      QList<std::pair<double,_QVariant>_>::constEnd
                ((QList<std::pair<double,_QVariant>_> *)in_stack_fffffffffffffe90);
      ppVar5 = &local_50;
      ::QVariant::QVariant((QVariant *)0x68dd08);
      std::pair<double,_QVariant>::pair<QVariant,_true>
                (in_stack_fffffffffffffe90,&in_stack_fffffffffffffe88->first,(QVariant *)0x68dd22);
      cVar6 = std::
              lower_bound<QList<std::pair<double,QVariant>>::const_iterator,std::pair<double,QVariant>,bool(*)(std::pair<double,QVariant>const&,std::pair<double,QVariant>const&)>
                        (__first,cVar6,ppVar5,__comp);
      local_b0 = cVar6;
      std::pair<double,_QVariant>::~pair((pair<double,_QVariant> *)0x68dd66);
      ::QVariant::~QVariant((QVariant *)cVar6.i);
      in_stack_fffffffffffffee8 = QList<std::pair<double,_QVariant>_>::constBegin(cVar6.i);
      bVar1 = QList<std::pair<double,_QVariant>_>::const_iterator::operator==
                        (&local_b0,in_stack_fffffffffffffee8);
      if (bVar1) {
        ppVar5 = QList<std::pair<double,_QVariant>_>::const_iterator::operator->(&local_b0);
        if (((ppVar5->first != 0.0) || (NAN(ppVar5->first))) ||
           (qVar4 = QList<std::pair<double,_QVariant>_>::size
                              ((QList<std::pair<double,_QVariant>_> *)(in_RDI + 0x140)), qVar4 < 2))
        {
          local_c0 = 0;
          std::pair<double,_QVariant>::pair<double,_QVariant_&,_true>
                    (cVar6.i,&in_stack_fffffffffffffe88->first,(QVariant *)0x68deba);
          std::pair<double,_QVariant>::operator=(cVar6.i,in_stack_fffffffffffffe88);
          std::pair<double,_QVariant>::~pair((pair<double,_QVariant> *)0x68dee0);
          QList<std::pair<double,_QVariant>_>::const_iterator::operator*(&local_b0);
          std::pair<double,_QVariant>::operator=(cVar6.i,in_stack_fffffffffffffe88);
        }
        else {
          QList<std::pair<double,_QVariant>_>::const_iterator::operator*(&local_b0);
          std::pair<double,_QVariant>::operator=(cVar6.i,in_stack_fffffffffffffe88);
          local_b8 = QList<std::pair<double,_QVariant>_>::const_iterator::operator+
                               (cVar6.i,(qsizetype)in_stack_fffffffffffffe88);
          QList<std::pair<double,_QVariant>_>::const_iterator::operator*(&local_b8);
          std::pair<double,_QVariant>::operator=(cVar6.i,in_stack_fffffffffffffe88);
        }
      }
      else {
        in_stack_fffffffffffffee0 = QList<std::pair<double,_QVariant>_>::constEnd(cVar6.i);
        bVar1 = QList<std::pair<double,_QVariant>_>::const_iterator::operator==
                          (&local_b0,in_stack_fffffffffffffee0);
        if (bVar1) {
          QList<std::pair<double,_QVariant>_>::const_iterator::operator--(&local_b0);
          ppVar5 = QList<std::pair<double,_QVariant>_>::const_iterator::operator->(&local_b0);
          if (((ppVar5->first != 1.0) || (NAN(ppVar5->first))) ||
             (qVar4 = QList<std::pair<double,_QVariant>_>::size
                                ((QList<std::pair<double,_QVariant>_> *)(in_RDI + 0x140)), qVar4 < 2
             )) {
            QList<std::pair<double,_QVariant>_>::const_iterator::operator*(&local_b0);
            std::pair<double,_QVariant>::operator=(cVar6.i,in_stack_fffffffffffffe88);
            local_d0 = 0x3ff0000000000000;
            std::pair<double,_QVariant>::pair<double,_QVariant_&,_true>
                      (cVar6.i,&in_stack_fffffffffffffe88->first,(QVariant *)0x68e035);
            std::pair<double,_QVariant>::operator=(cVar6.i,in_stack_fffffffffffffe88);
            std::pair<double,_QVariant>::~pair((pair<double,_QVariant> *)0x68e05f);
          }
          else {
            local_c8 = QList<std::pair<double,_QVariant>_>::const_iterator::operator-
                                 (cVar6.i,(qsizetype)in_stack_fffffffffffffe88);
            QList<std::pair<double,_QVariant>_>::const_iterator::operator*(&local_c8);
            std::pair<double,_QVariant>::operator=(cVar6.i,in_stack_fffffffffffffe88);
            QList<std::pair<double,_QVariant>_>::const_iterator::operator*(&local_b0);
            std::pair<double,_QVariant>::operator=(cVar6.i,in_stack_fffffffffffffe88);
          }
        }
        else {
          local_d8 = QList<std::pair<double,_QVariant>_>::const_iterator::operator-
                               (cVar6.i,(qsizetype)in_stack_fffffffffffffe88);
          QList<std::pair<double,_QVariant>_>::const_iterator::operator*(&local_d8);
          std::pair<double,_QVariant>::operator=(cVar6.i,in_stack_fffffffffffffe88);
          QList<std::pair<double,_QVariant>_>::const_iterator::operator*(&local_b0);
          std::pair<double,_QVariant>::operator=(cVar6.i,in_stack_fffffffffffffe88);
        }
      }
      updateInterpolator((QVariantAnimationPrivate *)cVar6.i);
    }
    setCurrentValueForProgress
              ((QVariantAnimationPrivate *)in_stack_fffffffffffffee8.i,
               (qreal)in_stack_fffffffffffffee0.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QVariantAnimationPrivate::recalculateCurrentInterval(bool force/*=false*/)
{
    // can't interpolate if we don't have at least 2 values
    if ((keyValues.size() + (defaultStartEndValue.isValid() ? 1 : 0)) < 2)
        return;

    const qreal endProgress = (direction == QAbstractAnimation::Forward) ? qreal(1) : qreal(0);
    const qreal progress = easing.value().valueForProgress(
            duration == 0 ? endProgress : qreal(currentTime) / qreal(duration));

    //0 and 1 are still the boundaries
    if (force || (currentInterval.start.first > 0 && progress < currentInterval.start.first)
        || (currentInterval.end.first < 1 && progress > currentInterval.end.first)) {
        //let's update currentInterval
        QVariantAnimation::KeyValues::const_iterator it = std::lower_bound(keyValues.constBegin(),
                                                                           keyValues.constEnd(),
                                                                           std::pair{progress, QVariant{}},
                                                                           animationValueLessThan);
        if (it == keyValues.constBegin()) {
            //the item pointed to by it is the start element in the range
            if (it->first == 0 && keyValues.size() > 1) {
                currentInterval.start = *it;
                currentInterval.end = *(it+1);
            } else {
                currentInterval.start = {qreal(0), defaultStartEndValue};
                currentInterval.end = *it;
            }
        } else if (it == keyValues.constEnd()) {
            --it; //position the iterator on the last item
            if (it->first == 1 && keyValues.size() > 1) {
                //we have an end value (item with progress = 1)
                currentInterval.start = *(it-1);
                currentInterval.end = *it;
            } else {
                //we use the default end value here
                currentInterval.start = *it;
                currentInterval.end = {qreal(1), defaultStartEndValue};
            }
        } else {
            currentInterval.start = *(it-1);
            currentInterval.end = *it;
        }

        // update all the values of the currentInterval
        updateInterpolator();
    }
    setCurrentValueForProgress(progress);
}